

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

double SoapySDRDevice_getMasterClockRate(SoapySDRDevice *device)

{
  undefined1 *puVar1;
  double dVar2;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  dVar2 = (double)(**(code **)(*(long *)device + 0x240))(device);
  return dVar2;
}

Assistant:

double SoapySDRDevice_getMasterClockRate(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return device->getMasterClockRate();
    __SOAPY_SDR_C_CATCH_RET(NAN);
}